

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr)

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  long in_RSI;
  int in_EDI;
  U32 llCode_1;
  U32 price;
  FSE_CState_t cstate;
  U32 llCode;
  FSE_CTable *in_stack_ffffffffffffffd8;
  FSE_CState_t *in_stack_ffffffffffffffe0;
  U32 local_4;
  
  if (*(int *)(in_RSI + 0x50) == 2) {
    UVar2 = ZSTD_LLcode(0);
    FSE_initCState(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_4 = LL_bits[UVar2];
    UVar2 = FSE_getMaxNbBits(in_stack_ffffffffffffffd8,UVar2);
    local_4 = local_4 + UVar2;
  }
  else if (*(int *)(in_RSI + 0x50) == 1) {
    local_4 = ZSTD_highbit32(in_EDI + 1);
  }
  else {
    UVar3 = ZSTD_LLcode(0);
    UVar2 = LL_bits[UVar3];
    iVar1 = *(int *)(in_RSI + 0x44);
    local_4 = ZSTD_highbit32(*(int *)(*(long *)(in_RSI + 8) + (ulong)UVar3 * 4) + 1);
    local_4 = (UVar2 + iVar1) - local_4;
  }
  return local_4;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr)
{
    if (optPtr->priceType == zop_static) {
        U32 const llCode = ZSTD_LLcode(litLength);
        FSE_CState_t cstate;
        FSE_initCState(&cstate, optPtr->symbolCosts->litlengthCTable);
        {   U32 const price = LL_bits[llCode]*BITCOST_MULTIPLIER + BITCOST_SYMBOL(cstate.symbolTT, cstate.stateLog, llCode);
            DEBUGLOG(8, "ZSTD_litLengthPrice: ll=%u, bitCost=%.2f", litLength, (double)price / BITCOST_MULTIPLIER);
            return price;
    }   }
    if (optPtr->priceType == zop_predef) return ZSTD_highbit32((U32)litLength+1);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] + optPtr->log2litLengthSum - ZSTD_highbit32(optPtr->litLengthFreq[llCode]+1)) * BITCOST_MULTIPLIER;
    }
}